

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_ordererror(lua_State *L,TValue *p1,TValue *p2)

{
  char *pcVar1;
  char *t2;
  char *t1;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  pcVar1 = luaT_typenames_[(int)((p1->tt_ & 0xfU) + 1)];
  if (pcVar1 == luaT_typenames_[(int)((p2->tt_ & 0xfU) + 1)]) {
    luaG_runerror(L,"attempt to compare two %s values",pcVar1);
  }
  luaG_runerror(L,"attempt to compare %s with %s",pcVar1,
                luaT_typenames_[(int)((p2->tt_ & 0xfU) + 1)]);
}

Assistant:

l_noret luaG_ordererror (lua_State *L, const TValue *p1, const TValue *p2) {
  const char *t1 = objtypename(p1);
  const char *t2 = objtypename(p2);
  if (t1 == t2)
    luaG_runerror(L, "attempt to compare two %s values", t1);
  else
    luaG_runerror(L, "attempt to compare %s with %s", t1, t2);
}